

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O0

void __thiscall
moodycamel::ConcurrentQueue<loop::MessageLoop::TaskInfo_*,_moodycamel::ConcurrentQueueDefaultTraits>
::ExplicitProducer::~ExplicitProducer(ExplicitProducer *this)

{
  index_t iVar1;
  unsigned_long a;
  Block *pBVar2;
  BlockIndexHeader *pBVar3;
  bool bVar4;
  bool local_16a;
  ulong local_158;
  BlockIndexHeader *prev;
  BlockIndexHeader *header;
  Block *nextBlock;
  Block *block_1;
  size_t lastValidIndex;
  size_t i_1;
  Block *block;
  size_t i;
  Block *halfDequeuedBlock;
  ExplicitProducer *this_local;
  memory_order __b_5;
  memory_order __b_4;
  memory_order __b_3;
  memory_order __b_2;
  memory_order __b_1;
  memory_order __b;
  
  (this->super_ProducerBase)._vptr_ProducerBase = (_func_int **)&PTR__ExplicitProducer_00282880;
  if ((this->super_ProducerBase).tailBlock != (Block *)0x0) {
    i = 0;
    std::operator&(memory_order_relaxed,__memory_order_mask);
    if (((this->super_ProducerBase).headIndex.super___atomic_base<unsigned_long>._M_i & 0x1f) != 0)
    {
      block = (Block *)(this->pr_blockIndexFront - this->pr_blockIndexSlotsUsed &
                       this->pr_blockIndexSize - 1);
      while( true ) {
        iVar1 = this->pr_blockIndexEntries[(long)block].base;
        std::operator&(memory_order_relaxed,__memory_order_mask);
        bVar4 = details::circular_less_than<unsigned_long>
                          (iVar1 + 0x20,
                           (this->super_ProducerBase).headIndex.super___atomic_base<unsigned_long>.
                           _M_i);
        if (!bVar4) break;
        block = (Block *)((ulong)((long)&block->field_0 + 1U) & this->pr_blockIndexSize - 1);
      }
      a = this->pr_blockIndexEntries[(long)block].base;
      std::operator&(memory_order_relaxed,__memory_order_mask);
      bVar4 = details::circular_less_than<unsigned_long>
                        (a,(this->super_ProducerBase).headIndex.super___atomic_base<unsigned_long>.
                           _M_i);
      if (!bVar4) {
        __assert_fail("details::circular_less_than<index_t>(pr_blockIndexEntries[i].base, this->headIndex.load(std::memory_order_relaxed))"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/xutiezhu[P]tqapi/lib/myutils/concurrentqueue.h"
                      ,0x6b7,
                      "virtual moodycamel::ConcurrentQueue<loop::MessageLoop::TaskInfo *>::ExplicitProducer::~ExplicitProducer() [T = loop::MessageLoop::TaskInfo *, Traits = moodycamel::ConcurrentQueueDefaultTraits]"
                     );
      }
      i = (size_t)this->pr_blockIndexEntries[(long)block].block;
    }
    i_1 = (size_t)(this->super_ProducerBase).tailBlock;
    do {
      i_1 = *(undefined8 *)(i_1 + 0x100);
      bVar4 = ConcurrentQueue<loop::MessageLoop::TaskInfo*,moodycamel::ConcurrentQueueDefaultTraits>
              ::Block::
              is_empty<(moodycamel::ConcurrentQueue<loop::MessageLoop::TaskInfo*,moodycamel::ConcurrentQueueDefaultTraits>::InnerQueueContext)1>
                        ((Block *)i_1);
      if (!bVar4) {
        lastValidIndex = 0;
        if (i_1 == i) {
          std::operator&(memory_order_relaxed,__memory_order_mask);
          lastValidIndex =
               (this->super_ProducerBase).headIndex.super___atomic_base<unsigned_long>._M_i & 0x1f;
        }
        std::operator&(memory_order_relaxed,__memory_order_mask);
        if (((this->super_ProducerBase).tailIndex.super___atomic_base<unsigned_long>._M_i & 0x1f) ==
            0) {
          local_158 = 0x20;
        }
        else {
          std::operator&(memory_order_relaxed,__memory_order_mask);
          local_158 = (this->super_ProducerBase).tailIndex.super___atomic_base<unsigned_long>._M_i &
                      0x1f;
        }
        while( true ) {
          local_16a = false;
          if (lastValidIndex != 0x20) {
            local_16a = (Block *)i_1 != (this->super_ProducerBase).tailBlock ||
                        lastValidIndex != local_158;
          }
          if (!local_16a) break;
          Block::operator[]((Block *)i_1,lastValidIndex);
          lastValidIndex = lastValidIndex + 1;
        }
      }
    } while ((Block *)i_1 != (this->super_ProducerBase).tailBlock);
  }
  if ((this->super_ProducerBase).tailBlock != (Block *)0x0) {
    nextBlock = (this->super_ProducerBase).tailBlock;
    do {
      pBVar2 = nextBlock->next;
      if ((nextBlock->dynamicallyAllocated & 1U) == 0) {
        add_block_to_free_list((this->super_ProducerBase).parent,nextBlock);
      }
      else {
        ConcurrentQueue<loop::MessageLoop::TaskInfo*,moodycamel::ConcurrentQueueDefaultTraits>::
        destroy<moodycamel::ConcurrentQueue<loop::MessageLoop::TaskInfo*,moodycamel::ConcurrentQueueDefaultTraits>::Block>
                  (nextBlock);
      }
      nextBlock = pBVar2;
    } while (pBVar2 != (this->super_ProducerBase).tailBlock);
  }
  prev = (BlockIndexHeader *)this->pr_blockIndexRaw;
  while (prev != (BlockIndexHeader *)0x0) {
    pBVar3 = (BlockIndexHeader *)prev->prev;
    ConcurrentQueueDefaultTraits::free(prev);
    prev = pBVar3;
  }
  ProducerBase::~ProducerBase(&this->super_ProducerBase);
  return;
}

Assistant:

~ExplicitProducer()
		{
			// Destruct any elements not yet dequeued.
			// Since we're in the destructor, we can assume all elements
			// are either completely dequeued or completely not (no halfways).
			if (this->tailBlock != nullptr) {		// Note this means there must be a block index too
				// First find the block that's partially dequeued, if any
				Block* halfDequeuedBlock = nullptr;
				if ((this->headIndex.load(std::memory_order_relaxed) & static_cast<index_t>(BLOCK_SIZE - 1)) != 0) {
					// The head's not on a block boundary, meaning a block somewhere is partially dequeued
					// (or the head block is the tail block and was fully dequeued, but the head/tail are still not on a boundary)
					size_t i = (pr_blockIndexFront - pr_blockIndexSlotsUsed) & (pr_blockIndexSize - 1);
					while (details::circular_less_than<index_t>(pr_blockIndexEntries[i].base + BLOCK_SIZE, this->headIndex.load(std::memory_order_relaxed))) {
						i = (i + 1) & (pr_blockIndexSize - 1);
					}
					assert(details::circular_less_than<index_t>(pr_blockIndexEntries[i].base, this->headIndex.load(std::memory_order_relaxed)));
					halfDequeuedBlock = pr_blockIndexEntries[i].block;
				}
				
				// Start at the head block (note the first line in the loop gives us the head from the tail on the first iteration)
				auto block = this->tailBlock;
				do {
					block = block->next;
					if (block->ConcurrentQueue::Block::template is_empty<explicit_context>()) {
						continue;
					}
					
					size_t i = 0;	// Offset into block
					if (block == halfDequeuedBlock) {
						i = static_cast<size_t>(this->headIndex.load(std::memory_order_relaxed) & static_cast<index_t>(BLOCK_SIZE - 1));
					}
					
					// Walk through all the items in the block; if this is the tail block, we need to stop when we reach the tail index
					auto lastValidIndex = (this->tailIndex.load(std::memory_order_relaxed) & static_cast<index_t>(BLOCK_SIZE - 1)) == 0 ? BLOCK_SIZE : static_cast<size_t>(this->tailIndex.load(std::memory_order_relaxed) & static_cast<index_t>(BLOCK_SIZE - 1));
					while (i != BLOCK_SIZE && (block != this->tailBlock || i != lastValidIndex)) {
						(*block)[i++]->~T();
					}
				} while (block != this->tailBlock);
			}
			
			// Destroy all blocks that we own
			if (this->tailBlock != nullptr) {
				auto block = this->tailBlock;
				do {
					auto nextBlock = block->next;
					if (block->dynamicallyAllocated) {
						destroy(block);
					}
					else {
						this->parent->add_block_to_free_list(block);
					}
					block = nextBlock;
				} while (block != this->tailBlock);
			}
			
			// Destroy the block indices
			auto header = static_cast<BlockIndexHeader*>(pr_blockIndexRaw);
			while (header != nullptr) {
				auto prev = static_cast<BlockIndexHeader*>(header->prev);
				header->~BlockIndexHeader();
				(Traits::free)(header);
				header = prev;
			}
		}